

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  float *pfVar1;
  float *pfVar2;
  ImVec4 *pIVar3;
  ImVec2 IVar4;
  ImVec4 *pIVar5;
  ImVec2 IVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ImVec2 *pIVar10;
  ImDrawIdx IVar11;
  int iVar12;
  ImDrawVert *pIVar13;
  ulong uVar14;
  ImDrawIdx IVar15;
  int iVar16;
  ImDrawIdx IVar17;
  ImDrawIdx *pIVar18;
  undefined7 in_register_00000081;
  ImDrawIdx IVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ImDrawIdx IVar24;
  byte bVar25;
  int iVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float afStack_a8 [2];
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  float afStack_90 [12];
  ulong local_60;
  ulong local_58;
  ImVec2 local_50;
  undefined4 local_48;
  int local_44;
  ulong local_40;
  uint local_38;
  ImU32 local_34;
  
  if (1 < points_count) {
    IVar4 = this->_Data->TexUvWhitePixel;
    local_60 = (ulong)(points_count - 1U);
    uVar14 = (ulong)(points_count - 1U);
    if (closed) {
      uVar14 = (ulong)(uint)points_count;
    }
    iVar26 = (int)uVar14;
    afStack_90[6] = thickness;
    if ((this->Flags & 1U) == 0) {
      uStack_a0 = 0x148fdf;
      local_40 = uVar14;
      PrimReserve(this,iVar26 * 6,iVar26 * 4);
      uVar14 = 1;
      do {
        uVar23 = uVar14 & 0xffffffff;
        if ((uint)points_count == uVar14) {
          uVar23 = 0;
        }
        fVar29 = points[uVar14 - 1].x;
        fVar28 = points[uVar14 - 1].y;
        fVar30 = points[uVar23].x - fVar29;
        fVar33 = points[uVar23].y - fVar28;
        fVar31 = fVar30 * fVar30 + fVar33 * fVar33;
        if (0.0 < fVar31) {
          fVar31 = 1.0 / SQRT(fVar31);
          fVar33 = fVar33 * fVar31;
          fVar30 = fVar30 * fVar31;
        }
        fVar33 = fVar33 * afStack_90[6] * 0.5;
        fVar30 = fVar30 * afStack_90[6] * 0.5;
        pIVar13 = this->_VtxWritePtr;
        IVar6.y = fVar28 - fVar30;
        IVar6.x = fVar29 + fVar33;
        pIVar13->pos = IVar6;
        pIVar13->uv = IVar4;
        pIVar13 = this->_VtxWritePtr;
        pIVar13->col = col;
        pIVar13[1].pos.x = points[uVar23].x + fVar33;
        pIVar13[1].pos.y = points[uVar23].y - fVar30;
        pIVar13[1].uv = IVar4;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[1].col = col;
        pIVar13[2].pos.x = points[uVar23].x - fVar33;
        pIVar13[2].pos.y = points[uVar23].y + fVar30;
        pIVar13[2].uv = IVar4;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[2].col = col;
        pIVar13[3].pos.x = points[uVar14 - 1].x - fVar33;
        pIVar13[3].pos.y = points[uVar14 - 1].y + fVar30;
        pIVar13[3].uv = IVar4;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[3].col = col;
        this->_VtxWritePtr = pIVar13 + 4;
        uVar20 = this->_VtxCurrentIdx;
        pIVar18 = this->_IdxWritePtr;
        IVar17 = (ImDrawIdx)uVar20;
        *pIVar18 = IVar17;
        pIVar18[1] = IVar17 + 1;
        pIVar18[2] = IVar17 + 2;
        pIVar18[3] = IVar17;
        pIVar18[4] = IVar17 + 2;
        pIVar18[5] = IVar17 + 3;
        this->_IdxWritePtr = pIVar18 + 6;
        this->_VtxCurrentIdx = uVar20 + 4;
        bVar27 = uVar14 != (local_40 & 0xffffffff);
        uVar14 = uVar14 + 1;
      } while (bVar27);
    }
    else {
      afStack_90[2] = thickness;
      if (thickness <= 1.0) {
        afStack_90[2] = 1.0;
      }
      local_44 = (int)afStack_90[2];
      fVar33 = this->_FringeScale;
      bVar25 = fVar33 == 1.0 & local_44 < 0x3f & (byte)this->Flags >> 1 &
               afStack_90[2] - (float)local_44 <= 1e-05;
      iVar12 = 0x12;
      if (thickness <= fVar33) {
        iVar12 = 0xc;
      }
      iVar16 = 6;
      if (bVar25 == 0) {
        iVar16 = iVar12;
      }
      _local_98 = ZEXT416((uint)fVar33);
      local_48 = (undefined4)CONCAT71(in_register_00000081,closed);
      if (bVar25 == 1) {
        iVar12 = points_count * 2;
        local_58 = 3;
      }
      else {
        iVar12 = points_count * 3;
        if (fVar33 < thickness) {
          iVar12 = points_count * 4;
        }
        local_58 = (ulong)((uint)(fVar33 < thickness) * 2 + 3);
      }
      local_38 = col & 0xffffff;
      local_40 = CONCAT44(local_40._4_4_,iVar12);
      uStack_a0 = 0x149244;
      local_50 = IVar4;
      local_34 = col;
      PrimReserve(this,iVar16 * iVar26,iVar12);
      lVar7 = -((ulong)(uint)((int)local_58 * points_count) * 8 + 0xf & 0xfffffffffffffff0);
      puVar9 = (undefined8 *)(local_98 + lVar7);
      uVar8 = (ulong)(uint)points_count;
      pfVar1 = (float *)(puVar9 + uVar8);
      uVar23 = 1;
      do {
        uVar22 = uVar23 & 0xffffffff;
        if (uVar8 == uVar23) {
          uVar22 = 0;
        }
        fVar33 = points[uVar22].x - points[uVar23 - 1].x;
        fVar30 = points[uVar22].y - points[uVar23 - 1].y;
        fVar29 = fVar33 * fVar33 + fVar30 * fVar30;
        if (0.0 < fVar29) {
          fVar29 = 1.0 / SQRT(fVar29);
          fVar33 = fVar33 * fVar29;
          fVar30 = fVar30 * fVar29;
        }
        *(float *)(local_98 + uVar23 * 8 + lVar7 + -8) = fVar30;
        *(float *)(local_98 + uVar23 * 8 + lVar7 + -4) = -fVar33;
        bVar27 = uVar23 != uVar14;
        uVar23 = uVar23 + 1;
      } while (bVar27);
      fVar33 = (float)local_98._0_4_;
      if ((char)local_48 == '\0') {
        uVar23 = local_60 & 0xffffffff;
        puVar9[uVar23] = *(undefined8 *)(pfVar1 + -4);
        fVar30 = points[uVar23].x;
        fVar29 = points[uVar23].y;
        if (afStack_90[6] <= (float)local_98._0_4_ || bVar25 != 0) {
          if (bVar25 != 0) {
            fVar33 = afStack_90[2] * 0.5 + 1.0;
          }
          fVar28 = (float)*puVar9 * fVar33;
          fVar31 = (float)((ulong)*puVar9 >> 0x20) * fVar33;
          fVar32 = (*points).x;
          fVar34 = (*points).y;
          *pfVar1 = fVar28 + fVar32;
          pfVar1[1] = fVar31 + fVar34;
          pfVar1[2] = fVar32 - fVar28;
          pfVar1[3] = fVar34 - fVar31;
          uVar22 = (ulong)(uint)((int)local_60 * 2);
          *(ulong *)(pfVar1 + uVar22 * 2) =
               CONCAT44((float)((ulong)puVar9[uVar23] >> 0x20) * fVar33 + fVar29,
                        (float)puVar9[uVar23] * fVar33 + fVar30);
          *(ulong *)(pfVar1 + uVar22 * 2 + 2) =
               CONCAT44(fVar29 - (float)((ulong)puVar9[uVar23] >> 0x20) * fVar33,
                        fVar30 - (float)puVar9[uVar23] * fVar33);
          goto LAB_001493d1;
        }
        fVar37 = (afStack_90[2] - (float)local_98._0_4_) * 0.5;
        fVar33 = (float)local_98._0_4_ + fVar37;
        fVar28 = (float)*puVar9;
        fVar31 = (float)((ulong)*puVar9 >> 0x20);
        fVar32 = fVar28 * fVar33;
        fVar34 = fVar31 * fVar33;
        fVar35 = (*points).x;
        fVar36 = (*points).y;
        fVar28 = fVar28 * fVar37;
        fVar31 = fVar31 * fVar37;
        *pfVar1 = fVar32 + fVar35;
        pfVar1[1] = fVar34 + fVar36;
        pfVar1[2] = fVar28 + fVar35;
        pfVar1[3] = fVar31 + fVar36;
        pfVar1[4] = fVar35 - fVar28;
        pfVar1[5] = fVar36 - fVar31;
        pfVar1[6] = fVar35 - fVar32;
        pfVar1[7] = fVar36 - fVar34;
        uVar22 = (ulong)(uint)((int)local_60 << 2);
        *(ulong *)(pfVar1 + uVar22 * 2) =
             CONCAT44((float)((ulong)puVar9[uVar23] >> 0x20) * fVar33 + fVar29,
                      (float)puVar9[uVar23] * fVar33 + fVar30);
        *(ulong *)(pfVar1 + uVar22 * 2 + 2) =
             CONCAT44((float)((ulong)puVar9[uVar23] >> 0x20) * fVar37 + fVar29,
                      (float)puVar9[uVar23] * fVar37 + fVar30);
        *(ulong *)(pfVar1 + uVar22 * 2 + 4) =
             CONCAT44(fVar29 - (float)((ulong)puVar9[uVar23] >> 0x20) * fVar37,
                      fVar30 - (float)puVar9[uVar23] * fVar37);
        *(ulong *)(pfVar1 + uVar22 * 2 + 6) =
             CONCAT44(fVar29 - (float)((ulong)puVar9[uVar23] >> 0x20) * fVar33,
                      fVar30 - (float)puVar9[uVar23] * fVar33);
      }
      else {
        if (afStack_90[6] <= (float)local_98._0_4_ || bVar25 != 0) {
          if (bVar25 != 0) {
            fVar33 = afStack_90[2] * 0.5 + 1.0;
          }
LAB_001493d1:
          pIVar18 = this->_IdxWritePtr;
          uVar23 = 1;
          uVar20 = this->_VtxCurrentIdx;
LAB_001493fd:
          uVar22 = uVar23 & 0xffffffff;
          if (uVar8 == uVar23) {
            uVar22 = 0;
          }
          uVar21 = uVar20 + (bVar25 ^ 3);
          if (uVar8 == uVar23) {
            uVar21 = this->_VtxCurrentIdx;
          }
          fVar31 = points[uVar22].x;
          fVar32 = points[uVar22].y;
          fVar29 = ((float)puVar9[uVar22] +
                   (float)*(undefined8 *)(local_98 + uVar23 * 8 + lVar7 + -8)) * 0.5;
          fVar28 = ((float)((ulong)puVar9[uVar22] >> 0x20) +
                   (float)((ulong)*(undefined8 *)(local_98 + uVar23 * 8 + lVar7 + -8) >> 0x20)) *
                   0.5;
          fVar34 = fVar29 * fVar29 + fVar28 * fVar28;
          fVar30 = 0.5;
          if (0.5 <= fVar34) {
            fVar30 = fVar34;
          }
          fVar29 = (1.0 / fVar30) * fVar29 * fVar33;
          fVar30 = (1.0 / fVar30) * fVar28 * fVar33;
          pfVar2 = pfVar1 + (ulong)(uint)((int)uVar22 * 2) * 2;
          *pfVar2 = fVar29 + fVar31;
          pfVar2[1] = fVar30 + fVar32;
          pfVar2[2] = fVar31 - fVar29;
          pfVar2[3] = fVar32 - fVar30;
          IVar17 = (ImDrawIdx)uVar21;
          *pIVar18 = IVar17;
          IVar24 = (ImDrawIdx)uVar20;
          pIVar18[1] = IVar24;
          if (bVar25 == 0) {
            pIVar18[2] = IVar24 + 2;
            pIVar18[3] = IVar24 + 2;
            pIVar18[4] = IVar17 + 2;
            pIVar18[5] = IVar17;
            pIVar18[6] = IVar17 + 1;
            pIVar18[7] = IVar24 + 1;
            pIVar18[8] = IVar24;
            pIVar18[9] = IVar24;
            pIVar18[10] = IVar17;
            pIVar18[0xb] = IVar17 + 1;
            pIVar18 = pIVar18 + 0xc;
            this->_IdxWritePtr = pIVar18;
            if (uVar14 != uVar23) goto LAB_00149518;
            pIVar13 = this->_VtxWritePtr;
            pIVar10 = (ImVec2 *)(puVar9 + uVar8 + 1);
            uVar14 = 0;
            do {
              pIVar13->pos = points[uVar14];
              this->_VtxWritePtr->uv = local_50;
              pIVar13 = this->_VtxWritePtr;
              pIVar13->col = local_34;
              pIVar13[1].pos = pIVar10[-1];
              this->_VtxWritePtr[1].uv = local_50;
              pIVar13 = this->_VtxWritePtr;
              pIVar13[1].col = local_38;
              pIVar13[2].pos = *pIVar10;
              this->_VtxWritePtr[2].uv = local_50;
              pIVar13 = this->_VtxWritePtr;
              pIVar13[2].col = local_38;
              pIVar13 = pIVar13 + 3;
              this->_VtxWritePtr = pIVar13;
              uVar14 = uVar14 + 1;
              pIVar10 = pIVar10 + 2;
            } while (uVar8 != uVar14);
          }
          else {
            pIVar18[2] = IVar24 + 1;
            pIVar18[3] = IVar17 + 1;
            pIVar18[4] = IVar24 + 1;
            pIVar18[5] = IVar17;
            pIVar18 = pIVar18 + 6;
            this->_IdxWritePtr = pIVar18;
            if (uVar14 != uVar23) goto LAB_00149518;
            pIVar13 = this->_VtxWritePtr;
            pIVar5 = this->_Data->TexUvLines;
            pIVar3 = pIVar5 + local_44;
            fVar33 = pIVar3->x;
            fVar30 = pIVar3->y;
            pIVar5 = pIVar5 + local_44;
            fVar29 = pIVar5->z;
            fVar28 = pIVar5->w;
            pIVar10 = (ImVec2 *)(puVar9 + uVar8 + 1);
            do {
              pIVar13->pos = pIVar10[-1];
              pIVar13 = this->_VtxWritePtr;
              (pIVar13->uv).x = fVar33;
              (pIVar13->uv).y = fVar30;
              pIVar13 = this->_VtxWritePtr;
              pIVar13->col = local_34;
              pIVar13[1].pos = *pIVar10;
              pIVar13 = this->_VtxWritePtr;
              pIVar13[1].uv.x = fVar29;
              pIVar13[1].uv.y = fVar28;
              pIVar13 = this->_VtxWritePtr;
              pIVar13[1].col = local_34;
              pIVar13 = pIVar13 + 2;
              this->_VtxWritePtr = pIVar13;
              pIVar10 = pIVar10 + 2;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
          goto LAB_0014987c;
        }
        fVar37 = (afStack_90[2] - (float)local_98._0_4_) * 0.5;
      }
      pIVar18 = this->_IdxWritePtr;
      uVar23 = 1;
      uVar20 = this->_VtxCurrentIdx;
      do {
        uVar22 = uVar23 & 0xffffffff;
        if (uVar8 == uVar23) {
          uVar22 = 0;
        }
        fVar30 = ((float)puVar9[uVar22] + (float)*(undefined8 *)(local_98 + uVar23 * 8 + lVar7 + -8)
                 ) * 0.5;
        fVar29 = ((float)((ulong)puVar9[uVar22] >> 0x20) +
                 (float)((ulong)*(undefined8 *)(local_98 + uVar23 * 8 + lVar7 + -8) >> 0x20)) * 0.5;
        fVar28 = fVar30 * fVar30 + fVar29 * fVar29;
        fVar33 = 0.5;
        if (0.5 <= fVar28) {
          fVar33 = fVar28;
        }
        uVar21 = uVar20 + 4;
        if (uVar8 == uVar23) {
          uVar21 = this->_VtxCurrentIdx;
        }
        fVar33 = 1.0 / fVar33;
        fVar32 = points[uVar22].x;
        fVar34 = points[uVar22].y;
        fVar28 = fVar30 * fVar33 * ((float)local_98._0_4_ + fVar37);
        fVar31 = fVar29 * fVar33 * ((float)local_98._0_4_ + fVar37);
        fVar30 = fVar30 * fVar33 * fVar37;
        fVar33 = fVar29 * fVar33 * fVar37;
        uVar22 = (ulong)(uint)((int)uVar22 << 2);
        pfVar2 = pfVar1 + uVar22 * 2;
        *pfVar2 = fVar32 + fVar28;
        pfVar2[1] = fVar34 + fVar31;
        pfVar2[2] = fVar32 + fVar30;
        pfVar2[3] = fVar34 + fVar33;
        IVar17 = (ImDrawIdx)uVar21;
        IVar15 = IVar17 + 1;
        pfVar2 = pfVar1 + uVar22 * 2 + 4;
        *pfVar2 = fVar32 - fVar30;
        pfVar2[1] = fVar34 - fVar33;
        pfVar2[2] = fVar32 - fVar28;
        pfVar2[3] = fVar34 - fVar31;
        *pIVar18 = IVar15;
        IVar24 = (ImDrawIdx)uVar20;
        IVar19 = IVar24 + 2;
        pIVar18[1] = IVar24 + 1;
        pIVar18[2] = IVar19;
        pIVar18[3] = IVar19;
        IVar11 = IVar17 + 2;
        pIVar18[4] = IVar11;
        pIVar18[5] = IVar15;
        pIVar18[6] = IVar15;
        pIVar18[7] = IVar24 + 1;
        pIVar18[8] = IVar24;
        pIVar18[9] = IVar24;
        pIVar18[10] = IVar17;
        pIVar18[0xb] = IVar15;
        pIVar18[0xc] = IVar11;
        pIVar18[0xd] = IVar19;
        pIVar18[0xe] = IVar24 + 3;
        pIVar18[0xf] = IVar24 + 3;
        pIVar18[0x10] = IVar17 + 3;
        pIVar18[0x11] = IVar11;
        pIVar18 = pIVar18 + 0x12;
        bVar27 = uVar23 != uVar14;
        uVar23 = uVar23 + 1;
        uVar20 = uVar21;
      } while (bVar27);
      this->_IdxWritePtr = pIVar18;
      pIVar13 = this->_VtxWritePtr;
      pIVar10 = (ImVec2 *)(puVar9 + uVar8 + 3);
      do {
        pIVar13->pos = pIVar10[-3];
        this->_VtxWritePtr->uv = local_50;
        pIVar13 = this->_VtxWritePtr;
        pIVar13->col = local_38;
        pIVar13[1].pos = pIVar10[-2];
        this->_VtxWritePtr[1].uv = local_50;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[1].col = local_34;
        pIVar13[2].pos = pIVar10[-1];
        this->_VtxWritePtr[2].uv = local_50;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[2].col = local_34;
        pIVar13[3].pos = *pIVar10;
        this->_VtxWritePtr[3].uv = local_50;
        pIVar13 = this->_VtxWritePtr;
        pIVar13[3].col = local_38;
        pIVar13 = pIVar13 + 4;
        this->_VtxWritePtr = pIVar13;
        pIVar10 = pIVar10 + 4;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
LAB_0014987c:
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_40;
    }
  }
  return;
LAB_00149518:
  uVar23 = uVar23 + 1;
  uVar20 = uVar21;
  goto LAB_001493fd;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}